

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractPosition
          (ValueExtractor *this,int *left,int *top,int *right,int *bottom,Origin *origin,
          Alignment *position,PositionMode *mode,Alignment *textAlignment)

{
  bool bVar1;
  QFlagsStorage<Qt::AlignmentFlag> QVar2;
  int iVar3;
  Alignment *pAVar4;
  long lVar5;
  Declaration *pDVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_3c = -0xff;
    extractFont(this,&this->f,&local_3c);
  }
  if ((this->declarations).d.size == 0) {
    bVar1 = false;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    bVar1 = false;
    do {
      pDVar6 = (this->declarations).d.ptr;
      iVar3 = *(int *)(*(long *)((long)&(pDVar6->d).d.ptr + lVar5) + 0x20);
      if (0xc < iVar3 - 0x4cU) goto switchD_005d8aee_caseD_53;
      pDVar6 = (Declaration *)((long)&(pDVar6->d).d.ptr + lVar5);
      switch(iVar3) {
      case 0x4c:
        iVar3 = lengthValue(this,pDVar6);
        *left = iVar3;
        goto LAB_005d8b66;
      case 0x4d:
        QVar2.i = lengthValue(this,pDVar6);
        pAVar4 = (Alignment *)right;
        break;
      case 0x4e:
        iVar3 = lengthValue(this,pDVar6);
        *top = iVar3;
        goto LAB_005d8b66;
      case 0x4f:
        QVar2.i = lengthValue(this,pDVar6);
        pAVar4 = (Alignment *)bottom;
        break;
      case 0x50:
        QVar2.i = Declaration::originValue(pDVar6);
        pAVar4 = (Alignment *)origin;
        break;
      case 0x51:
        QVar2.i = (Int)Declaration::alignmentValue(pDVar6);
        pAVar4 = position;
        break;
      case 0x52:
        QVar2.i = Declaration::positionValue(pDVar6);
        pAVar4 = (Alignment *)mode;
        break;
      default:
        goto switchD_005d8aee_caseD_53;
      case 0x58:
        QVar2.i = (Int)Declaration::alignmentValue(pDVar6);
        pAVar4 = textAlignment;
      }
      (pAVar4->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
      super_QFlagsStorage<Qt::AlignmentFlag>.i = QVar2.i;
LAB_005d8b66:
      bVar1 = true;
switchD_005d8aee_caseD_53:
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar7 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ValueExtractor::extractPosition(int *left, int *top, int *right, int *bottom, QCss::Origin *origin,
                                     Qt::Alignment *position, QCss::PositionMode *mode, Qt::Alignment *textAlignment)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Left: *left = lengthValue(decl); break;
        case Top: *top = lengthValue(decl); break;
        case Right: *right = lengthValue(decl); break;
        case Bottom: *bottom = lengthValue(decl); break;
        case QtOrigin: *origin = decl.originValue(); break;
        case QtPosition: *position = decl.alignmentValue(); break;
        case TextAlignment: *textAlignment = decl.alignmentValue(); break;
        case Position: *mode = decl.positionValue(); break;
        default: continue;
        }
        hit = true;
    }

    return hit;
}